

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_colorf nk_hsva_colorf(float h,float s,float v,float a)

{
  nk_colorf nVar1;
  int iVar2;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float f;
  float t;
  float q;
  float p;
  int i;
  nk_colorf out;
  float local_10;
  float fStack_c;
  float local_8;
  
  memset(&local_10,0,0x10);
  local_10 = in_XMM2_Da;
  fStack_c = in_XMM2_Da;
  local_8 = in_XMM2_Da;
  if (0.0 < in_XMM1_Da) {
    iVar2 = (int)(in_XMM0_Da / 0.16666667);
    fVar3 = in_XMM0_Da / 0.16666667 - (float)iVar2;
    local_8 = in_XMM2_Da * (1.0 - in_XMM1_Da);
    fVar4 = in_XMM2_Da * (1.0 - in_XMM1_Da * fVar3);
    fVar3 = in_XMM2_Da * (1.0 - in_XMM1_Da * (1.0 - fVar3));
    local_10 = in_XMM2_Da;
    fStack_c = fVar3;
    switch(iVar2) {
    case 0:
      break;
    case 1:
      local_10 = fVar4;
      fStack_c = in_XMM2_Da;
      break;
    case 2:
      local_10 = local_8;
      fStack_c = in_XMM2_Da;
      local_8 = fVar3;
      break;
    case 3:
      local_10 = local_8;
      fStack_c = fVar4;
      local_8 = in_XMM2_Da;
      break;
    case 4:
      local_10 = fVar3;
      fStack_c = local_8;
      local_8 = in_XMM2_Da;
      break;
    case 5:
      local_10 = in_XMM2_Da;
      fStack_c = local_8;
      local_8 = fVar4;
    }
  }
  nVar1.g = fStack_c;
  nVar1.r = local_10;
  nVar1.b = local_8;
  nVar1.a = in_XMM3_Da;
  return nVar1;
}

Assistant:

NK_API struct nk_colorf
nk_hsva_colorf(float h, float s, float v, float a)
{
int i;
float p, q, t, f;
struct nk_colorf out = {0,0,0,0};
if (s <= 0.0f) {
out.r = v; out.g = v; out.b = v; out.a = a;
return out;
}
h = h / (60.0f/360.0f);
i = (int)h;
f = h - (float)i;
p = v * (1.0f - s);
q = v * (1.0f - (s * f));
t = v * (1.0f - s * (1.0f - f));

switch (i) {
case 0: default: out.r = v; out.g = t; out.b = p; break;
case 1: out.r = q; out.g = v; out.b = p; break;
case 2: out.r = p; out.g = v; out.b = t; break;
case 3: out.r = p; out.g = q; out.b = v; break;
case 4: out.r = t; out.g = p; out.b = v; break;
case 5: out.r = v; out.g = p; out.b = q; break;}
out.a = a;
return out;
}